

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

void asmjit::v1_14::CodeHolder_resetInternal(CodeHolder *self,ResetPolicy resetPolicy)

{
  Section *pSVar1;
  bool bVar2;
  Section **ppSVar3;
  BaseEmitter *in_RDI;
  ZoneAllocator *allocator;
  Section *section;
  uint32_t numSections;
  ZoneVector<asmjit::v1_14::BaseEmitter_*> *emitters;
  uint32_t i;
  size_t in_stack_ffffffffffffff20;
  undefined8 *i_00;
  BaseEmitter *in_stack_ffffffffffffff28;
  CodeHolder *in_stack_ffffffffffffff30;
  ZoneAllocator *this;
  ResetPolicy resetPolicy_00;
  Zone *this_00;
  ResetPolicy local_b0;
  undefined8 local_78;
  undefined8 *local_68;
  EmitterType *local_60;
  CodeBuffer *local_58;
  RegOnly *local_50;
  Environment *local_48;
  Funcs *local_40;
  EmitArgsAssignment *local_38;
  Logger **local_30;
  CodeHolder **local_28;
  unsigned_long local_20;
  EmitterType *local_18;
  undefined4 local_c;
  CodeBuffer *local_8;
  
  this_00 = (Zone *)&in_RDI[1]._logger;
  local_b0 = *(ResetPolicy *)&in_RDI[1]._errorHandler;
  while (local_b0 != 0) {
    local_b0 = local_b0 + -1;
    in_stack_ffffffffffffff28 = in_RDI;
    ZoneVector<asmjit::v1_14::BaseEmitter_*>::operator[]
              ((ZoneVector<asmjit::v1_14::BaseEmitter_*> *)in_RDI,in_stack_ffffffffffffff20);
    CodeHolder::detach(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  memset(&local_78,0,8);
  i_00 = &local_78;
  local_78._0_1_ = 0;
  local_78._1_1_ = 0;
  local_78._2_1_ = 0;
  local_78._3_1_ = 0;
  local_78._4_1_ = 0;
  local_78._5_1_ = 0;
  local_78._6_1_ = 0;
  local_78._7_1_ = 0;
  in_RDI->_vptr_BaseEmitter = local_78;
  local_60 = &in_RDI->_emitterType;
  local_20 = 0;
  local_68 = i_00;
  local_18 = local_60;
  Support::Array<unsigned_long,_4UL>::fill((Array<unsigned_long,_4UL> *)local_60,&local_20);
  *(undefined8 *)&in_RDI->_privateData = 0xffffffffffffffff;
  in_RDI->_code = (CodeHolder *)0x0;
  in_RDI->_logger = (Logger *)0x0;
  resetPolicy_00 = in_RDI[1]._gpSignature._bits;
  for (local_b0 = kSoft; local_b0 < resetPolicy_00; local_b0 = local_b0 + kHard) {
    ppSVar3 = ZoneVector<asmjit::v1_14::Section_*>::operator[]
                        ((ZoneVector<asmjit::v1_14::Section_*> *)in_stack_ffffffffffffff28,
                         (size_t)i_00);
    pSVar1 = *ppSVar3;
    if ((pSVar1->_buffer)._data != (uint8_t *)0x0) {
      local_58 = &pSVar1->_buffer;
      local_c = 1;
      local_8 = local_58;
      bVar2 = Support::test<asmjit::v1_14::CodeBufferFlags,asmjit::v1_14::CodeBufferFlags>
                        ((pSVar1->_buffer)._flags,kIsExternal);
      if (!bVar2) {
        free((pSVar1->_buffer)._data);
      }
    }
    (pSVar1->_buffer)._data = (uint8_t *)0x0;
    (pSVar1->_buffer)._capacity = 0;
  }
  this = (ZoneAllocator *)&in_RDI->_funcs;
  local_30 = &in_RDI[1]._logger;
  *local_30 = (Logger *)0x0;
  *(undefined4 *)&in_RDI[1]._errorHandler = 0;
  *(undefined4 *)((long)&in_RDI[1]._errorHandler + 4) = 0;
  ZoneHashBase::reset((ZoneHashBase *)&in_RDI[1]._funcs.validate);
  local_38 = &in_RDI[1]._funcs.emitArgsAssignment;
  *local_38 = (EmitArgsAssignment)0x0;
  *(undefined4 *)&in_RDI[1]._funcs.formatInstruction = 0;
  *(undefined4 *)((long)&in_RDI[1]._funcs.formatInstruction + 4) = 0;
  local_40 = &in_RDI[1]._funcs;
  local_40->emitProlog = (EmitProlog)0x0;
  *(undefined4 *)&in_RDI[1]._funcs.emitEpilog = 0;
  *(undefined4 *)((long)&in_RDI[1]._funcs.emitEpilog + 4) = 0;
  local_48 = &in_RDI[1]._environment;
  local_48->_arch = kUnknown;
  local_48->_subArch = kHost;
  local_48->_vendor = kHost;
  local_48->_platform = kUnknown;
  local_48->_platformABI = kUnknown;
  local_48->_objectFormat = kUnknown;
  local_48->_floatABI = kHardFloat;
  local_48->_reserved = '\0';
  in_RDI[1]._gpSignature._bits = 0;
  in_RDI[1]._instOptions = kNone;
  local_50 = &in_RDI[1]._extraReg;
  local_50->_signature = 0;
  local_50->_id = 0;
  *(undefined4 *)&in_RDI[1]._inlineComment = 0;
  *(undefined4 *)((long)&in_RDI[1]._inlineComment + 4) = 0;
  in_RDI[2]._encodingOptions = kNone;
  in_RDI[2]._forcedInstOptions = kNone;
  *(undefined8 *)&in_RDI[2]._privateData = 0;
  local_28 = &in_RDI[2]._code;
  *local_28 = (CodeHolder *)0x0;
  ZoneAllocator::reset(this,(Zone *)in_stack_ffffffffffffff28);
  Zone::reset(this_00,resetPolicy_00);
  return;
}

Assistant:

static void CodeHolder_resetInternal(CodeHolder* self, ResetPolicy resetPolicy) noexcept {
  uint32_t i;
  const ZoneVector<BaseEmitter*>& emitters = self->emitters();

  i = emitters.size();
  while (i)
    self->detach(emitters[--i]);

  // Reset everything into its construction state.
  self->_environment.reset();
  self->_cpuFeatures.reset();
  self->_baseAddress = Globals::kNoBaseAddress;
  self->_logger = nullptr;
  self->_errorHandler = nullptr;

  // Reset all sections.
  uint32_t numSections = self->_sections.size();
  for (i = 0; i < numSections; i++) {
    Section* section = self->_sections[i];
    if (section->_buffer.data() && !section->_buffer.isExternal())
      ::free(section->_buffer._data);
    section->_buffer._data = nullptr;
    section->_buffer._capacity = 0;
  }

  // Reset zone allocator and all containers using it.
  ZoneAllocator* allocator = self->allocator();

  self->_emitters.reset();
  self->_namedLabels.reset();
  self->_relocations.reset();
  self->_labelEntries.reset();
  self->_sections.reset();
  self->_sectionsByOrder.reset();

  self->_unresolvedLinkCount = 0;
  self->_addressTableSection = nullptr;
  self->_addressTableEntries.reset();

  allocator->reset(&self->_zone);
  self->_zone.reset(resetPolicy);
}